

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O1

TRef simplify_intmul_k(jit_State *J,int32_t k)

{
  int32_t k_00;
  TRef TVar1;
  uint uVar2;
  
  if (k == 1) {
    uVar2 = (uint)(J->fold).ins.field_0.op1;
  }
  else if (k == 0) {
    uVar2 = (uint)(J->fold).ins.field_0.op2;
  }
  else if ((k & k - 1U) == 0) {
    (J->fold).ins.field_1.o = '$';
    k_00 = 0x1f;
    if (k != 0) {
      for (; (uint)k >> k_00 == 0; k_00 = k_00 + -1) {
      }
    }
    TVar1 = lj_ir_kint(J,k_00);
    (J->fold).ins.field_0.op2 = (IRRef1)TVar1;
    uVar2 = 1;
  }
  else {
    uVar2 = 0;
  }
  return uVar2;
}

Assistant:

static TRef simplify_intmul_k(jit_State *J, int32_t k)
{
  /* Note: many more simplifications are possible, e.g. 2^k1 +- 2^k2.
  ** But this is mainly intended for simple address arithmetic.
  ** Also it's easier for the backend to optimize the original multiplies.
  */
  if (k == 0) {  /* i * 0 ==> 0 */
    return RIGHTFOLD;
  } else if (k == 1) {  /* i * 1 ==> i */
    return LEFTFOLD;
  } else if ((k & (k-1)) == 0) {  /* i * 2^k ==> i << k */
    fins->o = IR_BSHL;
    fins->op2 = lj_ir_kint(J, lj_fls((uint32_t)k));
    return RETRYFOLD;
  }
  return NEXTFOLD;
}